

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

Point2f __thiscall pbrt::SphericalMapping2D::Sphere(SphericalMapping2D *this,Point3f *p)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  Tuple2<pbrt::Point2,_float> TVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [64];
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  
  fVar9 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar6 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)fVar9),ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  fVar7 = auVar8._0_4_ + (this->textureFromRender).m.m[0][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)fVar9),ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  fVar2 = auVar8._0_4_ + (this->textureFromRender).m.m[1][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)fVar9),ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  fVar3 = auVar8._0_4_ + (this->textureFromRender).m.m[2][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->textureFromRender).m.m[3][1])),
                           ZEXT416((uint)fVar9),ZEXT416((uint)(this->textureFromRender).m.m[3][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar6),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][2]));
  fVar9 = auVar8._0_4_ + (this->textureFromRender).m.m[3][3];
  bVar1 = fVar9 == 1.0;
  fVar5 = (float)((uint)bVar1 * (int)fVar7 + (uint)!bVar1 * (int)(fVar7 / fVar9));
  fVar6 = (float)((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar9));
  fVar7 = (float)((uint)bVar1 * (int)fVar3 + (uint)!bVar1 * (int)(fVar3 / fVar9));
  fVar9 = fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    auVar8 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
    fVar9 = auVar8._0_4_;
  }
  auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar7 / fVar9)));
  uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar7 / fVar9)),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar1 = (bool)((byte)uVar4 & 1);
  local_38._0_4_ = acosf((float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar8._0_4_));
  local_38._4_4_ = extraout_XMM0_Db;
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._12_4_ = extraout_XMM0_Dd;
  auVar11._0_4_ = atan2f(fVar6 / fVar9,fVar5 / fVar9);
  auVar11._4_60_ = extraout_var;
  uVar4 = vcmpss_avx512f(auVar11._0_16_,ZEXT416(0),1);
  bVar1 = (bool)((byte)uVar4 & 1);
  auVar8._4_12_ = extraout_var._0_12_;
  auVar8._0_4_ = (uint)bVar1 * (int)(auVar11._0_4_ + 6.2831855) + (uint)!bVar1 * (int)auVar11._0_4_;
  auVar8 = vinsertps_avx(local_38,auVar8,0x10);
  TVar10.x = auVar8._0_4_ * 0.31830987;
  TVar10.y = auVar8._4_4_ * 0.15915494;
  return (Point2f)TVar10;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sphere(const Point3f &p) const {
        Vector3f vec = Normalize(textureFromRender(p) - Point3f(0, 0, 0));
        Float theta = SphericalTheta(vec), phi = SphericalPhi(vec);
        return {theta * InvPi, phi * Inv2Pi};
    }